

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O2

apx_error_t
derive_hash_init_value(apx_dataElement_t *self,dtl_av_t *parsed_av,dtl_hv_t **derived_hv)

{
  char *pKey;
  int32_t iVar1;
  int32_t iVar2;
  apx_error_t aVar3;
  dtl_hv_t *self_00;
  apx_dataElement_t *self_01;
  dtl_dv_t *parsed_value;
  int index;
  apx_dataElement_t *derived_element;
  dtl_dv_t *derived_dv;
  dtl_hv_t **local_40;
  dtl_av_t *local_38;
  
  iVar1 = apx_dataElement_get_num_child_elements(self);
  self_00 = dtl_hv_new();
  if (self_00 == (dtl_hv_t *)0x0) {
    aVar3 = 2;
  }
  else {
    iVar2 = dtl_av_length(parsed_av);
    if (iVar1 == iVar2) {
      index = 0;
      local_40 = derived_hv;
      local_38 = parsed_av;
      if (iVar1 < 1) {
        iVar1 = index;
      }
      for (; iVar1 != index; index = index + 1) {
        derived_element = (apx_dataElement_t *)0x0;
        derived_dv = (dtl_dv_t *)0x0;
        self_01 = apx_dataElement_get_child_at(self,index);
        if (self_01 == (apx_dataElement_t *)0x0) {
          __assert_fail("child_element != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                        ,0x3cf,
                        "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                       );
        }
        pKey = self_01->name;
        if (pKey == (char *)0x0) {
          __assert_fail("child_name != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                        ,0x3d1,
                        "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                       );
        }
        aVar3 = apx_dataElement_derive_data_element
                          (self_01,&derived_element,(apx_dataElement_t **)0x0);
        if (aVar3 != 0) {
LAB_001270f9:
          dtl_hv_delete(self_00);
          return aVar3;
        }
        if (derived_element == (apx_dataElement_t *)0x0) {
          __assert_fail("derived_element != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                        ,0x3d8,
                        "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                       );
        }
        parsed_value = dtl_av_value(local_38,index);
        aVar3 = apx_dataElement_derive_proper_init_value(derived_element,parsed_value,&derived_dv);
        if (aVar3 != 0) {
          if (derived_dv != (dtl_dv_t *)0x0) {
            __assert_fail("derived_dv == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/data_element.c"
                          ,0x3dd,
                          "apx_error_t derive_hash_init_value(apx_dataElement_t *, dtl_av_t *, dtl_hv_t **)"
                         );
          }
          goto LAB_001270f9;
        }
        dtl_hv_set_cstr(self_00,pKey,derived_dv,false);
      }
      *local_40 = self_00;
      aVar3 = 0;
    }
    else {
      aVar3 = 0x46;
    }
  }
  return aVar3;
}

Assistant:

static apx_error_t derive_hash_init_value(apx_dataElement_t* self, dtl_av_t* parsed_av, dtl_hv_t** derived_hv)
{
   dtl_hv_t* hv;
   int32_t num_children = apx_dataElement_get_num_child_elements(self);
   hv = dtl_hv_new();
   if (hv == NULL)
   {
      return APX_MEM_ERROR;
   }
   if (num_children != dtl_av_length(parsed_av))
   {
      return APX_VALUE_LENGTH_ERROR;
   }
   for (int32_t i = 0; i < num_children; i++)
   {
      apx_error_t result;
      apx_dataElement_t* derived_element = NULL;      
      dtl_dv_t* parsed_dv = NULL;
      dtl_dv_t* derived_dv = NULL;
      apx_dataElement_t* child_element = apx_dataElement_get_child_at(self, i);
      char const* child_name = NULL;
      assert(child_element != NULL);
      child_name = apx_dataElement_get_name(child_element);
      assert(child_name != NULL);
      result = apx_dataElement_derive_data_element(child_element, &derived_element, NULL);
      if (result != APX_NO_ERROR)
      {
         dtl_hv_delete(hv);
         return result;
      }
      assert(derived_element != NULL);
      parsed_dv = dtl_av_value(parsed_av, i);
      result = apx_dataElement_derive_proper_init_value(derived_element, parsed_dv, &derived_dv);
      if (result != APX_NO_ERROR)
      {
         assert(derived_dv == NULL);
         dtl_hv_delete(hv);
         return result;
      }      
      dtl_hv_set_cstr(hv, child_name, derived_dv, false);
   }
   *derived_hv = hv;
   return APX_NO_ERROR;
}